

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

int32_t __thiscall date_parse_result::dayno(date_parse_result *this)

{
  int iVar1;
  int32_t iVar2;
  date_parse_result *in_RDI;
  caldate_t cd;
  int corr;
  caldate_t jan4;
  caldate_t *in_stack_ffffffffffffffd0;
  caldate_t local_1c;
  date_parse_result *this_00;
  
  this_00 = in_RDI;
  iVar1 = has_iso_week(in_RDI);
  if ((iVar1 != 0) && (iVar1 = has_year(in_RDI), iVar1 != 0)) {
    caldate_t::caldate_t(&local_1c,in_RDI->yy,1,4);
    iVar1 = caldate_t::iso_weekday(in_stack_ffffffffffffffd0);
    caldate_t::caldate_t((caldate_t *)&stack0xffffffffffffffd4,in_RDI->yy,1,in_RDI->w - (iVar1 + 3))
    ;
    iVar2 = caldate_t::dayno((caldate_t *)this_00);
    return iVar2;
  }
  (*in_RDI->cal->_vptr_multicaldate_t[8])
            (in_RDI->cal,(ulong)(uint)in_RDI->yy,(ulong)(uint)in_RDI->mm,(ulong)(uint)in_RDI->dd);
  iVar1 = (*in_RDI->cal->_vptr_multicaldate_t[2])();
  return iVar1;
}

Assistant:

int32_t dayno() const
    {
        /* if there's an ISO weekday, convert it to a calendar date */
        if (has_iso_week() && has_year())
        {
            /* 
             *   Calculate the "correction factor" - this is the ISO weekday
             *   number of January 4 of the year, plus 3.  Note that this is
             *   explicitly defined as Jan 4 *Gregorian* by the standard, so
             *   this isn't relative to the calendar we're parsing for.
             */
            caldate_t jan4(yy, 1, 4);
            int corr = jan4.iso_weekday() + 3;

            /* 
             *   Set the date to "January 'ord'", where 'ord' is the ISO
             *   ordinal day number calculated from the weekday and
             *   correction factor.  This won't necessarily be a valid date
             *   in January, but caldate_t handles overflows in the day by
             *   carrying into the month and year as needed.
             */
            caldate_t cd(yy, 1, w - corr);
            return cd.dayno();
        }
        else
        {
            /* set the calendar date to our year, month, and day */
            cal->set_date(yy, mm, dd);

            /* return the day number from the calendar date */
            return cal->dayno();
        }
    }